

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

double __thiscall Comparator::score(Comparator *this,ScheduleHandle *s)

{
  size_t sVar1;
  uint64_t uVar2;
  element_type *this_00;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_68;
  double exceeded_time_ratio;
  double exceeded_memory_ratio;
  pair<unsigned_long,_unsigned_long> local_38;
  long local_28;
  uint64_t total_time;
  size_t peak_memory;
  ScheduleHandle *s_local;
  Comparator *this_local;
  
  peak_memory = (size_t)s;
  s_local = (ScheduleHandle *)this;
  this_00 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)s)
  ;
  local_38 = Schedule::analyze(this_00);
  std::tie<unsigned_long,unsigned_long>((unsigned_long *)&exceeded_memory_ratio,&total_time);
  std::tuple<unsigned_long&,unsigned_long&>::operator=
            ((tuple<unsigned_long&,unsigned_long&> *)&exceeded_memory_ratio,&local_38);
  if (this->limit < total_time) {
    sVar1 = this->limit;
    lVar3 = total_time - sVar1;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    auVar6._8_4_ = (int)(sVar1 >> 0x20);
    auVar6._0_8_ = sVar1;
    auVar6._12_4_ = 0x45300000;
    local_68 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
               ((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  }
  else {
    local_68 = 0.0;
  }
  uVar2 = this->origin_time;
  local_28 = local_28 - uVar2;
  auVar5._8_4_ = (int)((ulong)local_28 >> 0x20);
  auVar5._0_8_ = local_28;
  auVar5._12_4_ = 0x45300000;
  auVar7._8_4_ = (int)(uVar2 >> 0x20);
  auVar7._0_8_ = uVar2;
  auVar7._12_4_ = 0x45300000;
  return local_68 * 0.6 +
         (((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_28) - 4503599627370496.0)) /
         ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0))) * 0.4;
}

Assistant:

double score(const ScheduleHandle &s) const {
        size_t peak_memory;
        uint64_t total_time;
        std::tie(peak_memory, total_time) = s->analyze();

        // Using exceeded ratio to compare, lower is better
        double exceeded_memory_ratio = peak_memory > limit ? (static_cast<double>(peak_memory - limit) / limit) : 0;
        double exceeded_time_ratio = static_cast<double>(total_time - origin_time) / origin_time;
        return MEMORY_FACTOR * exceeded_memory_ratio + TIME_FACTOR * exceeded_time_ratio;
    }